

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-builder.h
# Opt level: O0

StructGet * __thiscall
wasm::Builder::makeStructGet
          (Builder *this,Index index,Expression *ref,MemoryOrder order,Type type,bool signed_)

{
  StructGet *this_00;
  StructGet *ret;
  bool signed__local;
  MemoryOrder order_local;
  Expression *ref_local;
  Index index_local;
  Builder *this_local;
  Type type_local;
  
  this_00 = MixedArena::alloc<wasm::StructGet>(&this->wasm->allocator);
  this_00->index = index;
  this_00->ref = ref;
  (this_00->super_SpecificExpression<(wasm::Expression::Id)66>).super_Expression.type.id = type.id;
  this_00->signed_ = signed_;
  this_00->order = order;
  StructGet::finalize(this_00);
  return this_00;
}

Assistant:

StructGet* makeStructGet(Index index,
                           Expression* ref,
                           MemoryOrder order,
                           Type type,
                           bool signed_ = false) {
    auto* ret = wasm.allocator.alloc<StructGet>();
    ret->index = index;
    ret->ref = ref;
    ret->type = type;
    ret->signed_ = signed_;
    ret->order = order;
    ret->finalize();
    return ret;
  }